

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Close(sqlite3 *db,int forceZombie)

{
  u32 uVar1;
  Schema *pSVar2;
  void *pvVar3;
  int iVar4;
  VTable **ppVVar5;
  VTable *pVVar6;
  VTable *pVTab;
  HashElem *pHVar7;
  long lVar8;
  
  iVar4 = 0;
  if (db != (sqlite3 *)0x0) {
    uVar1 = db->magic;
    if (((uVar1 == 0xa029a697) || (uVar1 == 0xf03b7906)) || (uVar1 == 0x4b771290)) {
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
      }
      sqlite3BtreeEnterAll(db);
      iVar4 = db->nDb;
      if (0 < iVar4) {
        lVar8 = 0;
        do {
          pSVar2 = db->aDb[lVar8].pSchema;
          if ((pSVar2 != (Schema *)0x0) &&
             (pHVar7 = (pSVar2->tblHash).first, pHVar7 != (HashElem *)0x0)) {
            do {
              pvVar3 = pHVar7->data;
              if (((*(byte *)((long)pvVar3 + 0x46) & 0x10) != 0) &&
                 (pVTab = *(VTable **)((long)pvVar3 + 0x58), pVTab != (VTable *)0x0)) {
                if (pVTab->db == db) {
                  ppVVar5 = (VTable **)((long)pvVar3 + 0x58);
                }
                else {
                  do {
                    pVVar6 = pVTab;
                    pVTab = pVVar6->pNext;
                    if (pVTab == (VTable *)0x0) goto LAB_001531ad;
                  } while (pVTab->db != db);
                  ppVVar5 = &pVVar6->pNext;
                }
                *ppVVar5 = pVTab->pNext;
                sqlite3VtabUnlock(pVTab);
              }
LAB_001531ad:
              pHVar7 = pHVar7->next;
            } while (pHVar7 != (HashElem *)0x0);
            iVar4 = db->nDb;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < iVar4);
      }
      sqlite3BtreeLeaveAll(db);
      callFinaliser(db,0x88);
      if ((forceZombie == 0) && (iVar4 = connectionIsBusy(db), iVar4 != 0)) {
        sqlite3Error(db,5,"unable to close due to unfinalized statements or unfinished backups");
        if (db->mutex == (sqlite3_mutex *)0x0) {
          return 5;
        }
        (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
        return 5;
      }
      db->magic = 0x64cffc7f;
      sqlite3LeaveMutexAndCloseZombie(db);
      iVar4 = 0;
    }
    else {
      iVar4 = 0x15;
      sqlite3_log(0x15,"API call with %s database connection pointer","invalid");
      sqlite3_log(0x15,"misuse at line %d of [%.10s]",0x1c396,
                  "118a3b35693b134d56ebd780123b7fd6f1497668");
    }
  }
  return iVar4;
}

Assistant:

static int sqlite3Close(sqlite3 *db, int forceZombie){
  if( !db ){
    return SQLITE_OK;
  }
  if( !sqlite3SafetyCheckSickOrOk(db) ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(db->mutex);

  /* Force xDisconnect calls on all virtual tables */
  disconnectAllVtab(db);

  /* If a transaction is open, the disconnectAllVtab() call above
  ** will not have called the xDisconnect() method on any virtual
  ** tables in the db->aVTrans[] array. The following sqlite3VtabRollback()
  ** call will do so. We need to do this before the check for active
  ** SQL statements below, as the v-table implementation may be storing
  ** some prepared statements internally.
  */
  sqlite3VtabRollback(db);

  /* Legacy behavior (sqlite3_close() behavior) is to return
  ** SQLITE_BUSY if the connection can not be closed immediately.
  */
  if( !forceZombie && connectionIsBusy(db) ){
    sqlite3Error(db, SQLITE_BUSY, "unable to close due to unfinalized "
       "statements or unfinished backups");
    sqlite3_mutex_leave(db->mutex);
    return SQLITE_BUSY;
  }

#ifdef SQLITE_ENABLE_SQLLOG
  if( sqlite3GlobalConfig.xSqllog ){
    /* Closing the handle. Fourth parameter is passed the value 2. */
    sqlite3GlobalConfig.xSqllog(sqlite3GlobalConfig.pSqllogArg, db, 0, 2);
  }
#endif

  /* Convert the connection into a zombie and then close it.
  */
  db->magic = SQLITE_MAGIC_ZOMBIE;
  sqlite3LeaveMutexAndCloseZombie(db);
  return SQLITE_OK;
}